

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall
TxConfirmStats::Read(TxConfirmStats *this,AutoFile *filein,int nFileVersion,size_t numBuckets)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  runtime_error *this_00;
  undefined4 in_register_00000014;
  long lVar9;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  Wrapper<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,_std::vector<double,_std::allocator<double>_>_&>
  local_48;
  size_t maxConfirms;
  size_t numBuckets_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  numBuckets_local = numBuckets;
  anon_unknown.dwarf_270427d::EncodedDoubleFormatter::Unser<AutoFile>
            ((EncodedDoubleFormatter *)filein,(AutoFile *)&this->decay,
             (double *)CONCAT44(in_register_00000014,nFileVersion));
  if ((this->decay <= 0.0) || (1.0 <= this->decay)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Corrupt estimates file. Decay must be between 0 and 1 (non-inclusive)");
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_007bb7bb;
  }
  else {
    uVar5 = ser_readdata32<AutoFile>(filein);
    this->scale = uVar5;
    if (uVar5 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Corrupt estimates file. Scale must be non-zero");
      if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_007bb7bb;
    }
    else {
      local_48.m_object = &this->m_feerate_avg;
      AutoFile::operator>>(filein,&local_48);
      if ((long)(this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 == numBuckets) {
        local_48.m_object = &this->txCtAvg;
        AutoFile::operator>>(filein,&local_48);
        if ((long)(this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 == numBuckets) {
          local_48.m_object = (vector<double,_std::allocator<double>_> *)&this->confAvg;
          AutoFile::operator>>
                    (filein,(Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
                             *)&local_48);
          pvVar2 = (this->confAvg).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar9 = (long)(this->confAvg).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
          uVar7 = lVar9 / 0x18;
          maxConfirms = this->scale * uVar7;
          if (maxConfirms - 0x3f1 < 0xfffffffffffffc10) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10,0x18,lVar9 % 0x18);
            std::runtime_error::runtime_error
                      (this_00,
                       "Corrupt estimates file.  Must maintain estimates for between 1 and 1008 (one week) confirms"
                      );
            if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_007bb7bb;
          }
          else {
            uVar6 = 0;
            do {
              uVar8 = (ulong)uVar6;
              if (uVar7 <= uVar8) {
                local_48.m_object = (vector<double,_std::allocator<double>_> *)&this->failAvg;
                AutoFile::operator>>
                          (filein,(Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
                                   *)&local_48);
                pvVar2 = (this->failAvg).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (lVar9 != (long)(this->failAvg).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (this_00,
                             "Corrupt estimates file. Mismatch in confirms tracked for failures");
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) goto LAB_007bb5af;
                  goto LAB_007bb7bb;
                }
                uVar8 = 0;
                goto LAB_007bb562;
              }
              uVar6 = uVar6 + 1;
            } while ((long)*(pointer *)
                            ((long)&pvVar2[uVar8].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + 8) -
                     *(long *)&pvVar2[uVar8].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data >> 3 == numBuckets);
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,
                       "Corrupt estimates file. Mismatch in feerate conf average bucket count");
            if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_007bb7bb:
              __stack_chk_fail();
            }
          }
        }
        else {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"Corrupt estimates file. Mismatch in tx count bucket count");
          if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_007bb7bb;
        }
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"Corrupt estimates file. Mismatch in feerate average bucket count");
        if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_007bb7bb;
      }
    }
  }
  goto LAB_007bb5af;
  while (pvVar3 = pvVar2 + uVar8, pvVar1 = pvVar2 + uVar8, uVar8 = (ulong)((int)uVar8 + 1),
        (long)*(pointer *)
               ((long)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + 8) -
        *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data >> 3 == numBuckets) {
LAB_007bb562:
    if (uVar7 <= uVar8) {
      resizeInMemoryCounters(this,numBuckets);
      bVar4 = ::LogAcceptCategory((LogFlags)this,(Level)numBuckets);
      if (bVar4) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file._M_len = 0x5f;
        logging_function._M_str = "Read";
        logging_function._M_len = 4;
        LogPrintFormatInternal<unsigned_long,unsigned_long>
                  (logging_function,source_file,0x1d6,ESTIMATEFEE,Debug,
                   (ConstevalFormatString<2U>)0xcb7562,&numBuckets_local,&maxConfirms);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      goto LAB_007bb7bb;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Corrupt estimates file. Mismatch in one of failure average bucket counts");
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_007bb7bb;
LAB_007bb5af:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TxConfirmStats::Read(AutoFile& filein, int nFileVersion, size_t numBuckets)
{
    // Read data file and do some very basic sanity checking
    // buckets and bucketMap are not updated yet, so don't access them
    // If there is a read failure, we'll just discard this entire object anyway
    size_t maxConfirms, maxPeriods;

    // The current version will store the decay with each individual TxConfirmStats and also keep a scale factor
    filein >> Using<EncodedDoubleFormatter>(decay);
    if (decay <= 0 || decay >= 1) {
        throw std::runtime_error("Corrupt estimates file. Decay must be between 0 and 1 (non-inclusive)");
    }
    filein >> scale;
    if (scale == 0) {
        throw std::runtime_error("Corrupt estimates file. Scale must be non-zero");
    }

    filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(m_feerate_avg);
    if (m_feerate_avg.size() != numBuckets) {
        throw std::runtime_error("Corrupt estimates file. Mismatch in feerate average bucket count");
    }
    filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(txCtAvg);
    if (txCtAvg.size() != numBuckets) {
        throw std::runtime_error("Corrupt estimates file. Mismatch in tx count bucket count");
    }
    filein >> Using<VectorFormatter<VectorFormatter<EncodedDoubleFormatter>>>(confAvg);
    maxPeriods = confAvg.size();
    maxConfirms = scale * maxPeriods;

    if (maxConfirms <= 0 || maxConfirms > 6 * 24 * 7) { // one week
        throw std::runtime_error("Corrupt estimates file.  Must maintain estimates for between 1 and 1008 (one week) confirms");
    }
    for (unsigned int i = 0; i < maxPeriods; i++) {
        if (confAvg[i].size() != numBuckets) {
            throw std::runtime_error("Corrupt estimates file. Mismatch in feerate conf average bucket count");
        }
    }

    filein >> Using<VectorFormatter<VectorFormatter<EncodedDoubleFormatter>>>(failAvg);
    if (maxPeriods != failAvg.size()) {
        throw std::runtime_error("Corrupt estimates file. Mismatch in confirms tracked for failures");
    }
    for (unsigned int i = 0; i < maxPeriods; i++) {
        if (failAvg[i].size() != numBuckets) {
            throw std::runtime_error("Corrupt estimates file. Mismatch in one of failure average bucket counts");
        }
    }

    // Resize the current block variables which aren't stored in the data file
    // to match the number of confirms and buckets
    resizeInMemoryCounters(numBuckets);

    LogDebug(BCLog::ESTIMATEFEE, "Reading estimates: %u buckets counting confirms up to %u blocks\n",
             numBuckets, maxConfirms);
}